

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_compression_zstd.c
# Opt level: O3

void verify_zstd_contents(char *buff,size_t used)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  tm *ptVar8;
  archive *a;
  unsigned_long uVar9;
  la_ssize_t v2;
  char *pcVar10;
  ulong uVar11;
  void *p_;
  long lVar12;
  char *p__00;
  int *piVar13;
  int *_v1;
  void *pvVar14;
  char *pcVar15;
  void *p__01;
  archive_entry *ae;
  char filedata [23];
  tm_conflict tmbuf;
  archive_entry *local_90;
  undefined1 local_88 [13];
  undefined1 local_7b [19];
  tm local_68;
  
  ptVar8 = localtime_r(&now,&local_68);
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                   ,L'U',(uint)(a != (archive *)0x0),"(zip_archive = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar4 = archive_read_support_format_zip(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'V',0,"ARCHIVE_OK",(long)wVar4,
                      "archive_read_support_format_zip(zip_archive)",a);
  iVar5 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar5,
                      "archive_read_support_filter_all(zip_archive)",a);
  iVar5 = archive_read_open_memory(a,buff,used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar5,
                      "archive_read_open_memory(zip_archive, buff, used)",a);
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'a',buff + (used - 0x16),"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",
                      (void *)0x0);
  failure("This must be disk 0");
  uVar1 = i2le(buff + (used - 0x12));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'c',(ulong)uVar1,"i2le(p + 4)",0,"0",(void *)0x0);
  failure("Central dir must start on disk 0");
  uVar1 = i2le(buff + (used - 0x10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'e',(ulong)uVar1,"i2le(p + 6)",0,"0",(void *)0x0);
  failure("All central dir entries are on this disk");
  uVar1 = i2le(buff + (used - 0xe));
  uVar2 = i2le(buff + (used - 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'g',(ulong)uVar1,"i2le(p + 8)",(ulong)uVar2,"i2le(p + 10)",(void *)0x0);
  pcVar15 = buff + (used - 10);
  uVar6 = i4le(pcVar15);
  pcVar10 = buff + (used - 6);
  uVar7 = i4le(pcVar10);
  failure("CD start (%u) + CD length (%u) should == archive size - 22",(ulong)uVar6,(ulong)uVar7);
  uVar6 = i4le(pcVar15);
  uVar7 = i4le(pcVar10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'j',(ulong)(uVar6 + uVar7),"i4le(p + 12) + i4le(p + 16)",used - 0x16,
                      "used - 22",(void *)0x0);
  failure("no zip comment");
  uVar1 = i2le(buff + (used - 2));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'l',(ulong)uVar1,"i2le(p + 20)",0,"0",(void *)0x0);
  uVar6 = i4le(pcVar10);
  uVar11 = (ulong)uVar6;
  pcVar10 = buff + uVar11;
  uVar6 = i4le(pcVar15);
  failure("Central file record at offset %u should begin with PK\\001\\002 signature",(ulong)uVar6);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'u',pcVar10,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar1 = i2le(pcVar10 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'v',(ulong)uVar1,"i2le(p + 4)",0x33f,"3 * 256 + 63",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'w',(ulong)uVar1,"i2le(p + 6)",0x3f,"63",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'x',(ulong)uVar1,"i2le(p + 8)",8,"8",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'y',(ulong)uVar1,"i2le(p + 10)",0x5d,"93",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'z',(ulong)uVar1,"i2le(p + 12)",
                      (long)(ptVar8->tm_sec / 2 + ptVar8->tm_min * 0x20 + ptVar8->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'{',(ulong)uVar1,"i2le(p + 14)",
                      (long)(ptVar8->tm_mon * 0x20 + ptVar8->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar8->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar9 = bitcrc32(0,"~Z`^YXNWVGHIJ",0xd);
  uVar9 = bitcrc32(uVar9,"UTSMRQPOKL",10);
  uVar6 = i4le(buff + uVar11 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'~',(ulong)uVar6,"i4le(p + 16)",uVar9,"crc",(void *)0x0);
  uVar6 = i4le(buff + uVar11 + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x7f',(ulong)uVar6,"i4le(p + 24)",0x17,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x1c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x80',(ulong)uVar1,"i2le(p + 28)",4,"strlen(file_name)",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x1e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x81',(ulong)uVar1,"i2le(p + 30)",0x18,"24",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x82',(ulong)uVar1,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x83',(ulong)uVar1,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x84',(ulong)uVar1,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar6 = i4le(buff + uVar11 + 0x26);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x85',(ulong)(uVar6 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar6 = i4le(buff + uVar11 + 0x2a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x86',(ulong)uVar6,"i4le(p + 42)",0,"0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x87',buff + uVar11 + 0x2e,"p + 46","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x32);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x8a',(ulong)uVar1,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x34);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x8b',(ulong)uVar1,"i2le(p + 2)",0xb,"11",(void *)0x0);
  uVar1 = i2le(buff + uVar11 + 0x34);
  uVar11 = (ulong)uVar1;
  uVar1 = i2le(pcVar10 + uVar11 + 0x36);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x8f',(ulong)uVar1,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  uVar1 = i2le(pcVar10 + uVar11 + 0x38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x90',(ulong)uVar1,"i2le(p + 2)",5,"5",(void *)0x0);
  pcVar15 = pcVar10 + uVar11 + 0x3a;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x91',(long)*pcVar15,"p[4]",1,"1",(void *)0x0);
  uVar6 = i4le(pcVar10 + uVar11 + 0x3b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x92',(ulong)uVar6,"i4le(p + 5)",now,"now",(void *)0x0);
  uVar1 = i2le(pcVar10 + uVar11 + 0x38);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x97',buff,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar2 = i2le(buff + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x98',(ulong)uVar2,"i2le(q + 4)",0x3f,"63",(void *)0x0);
  uVar2 = i2le(buff + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x99',(ulong)uVar2,"i2le(q + 6)",8,"8",(void *)0x0);
  uVar2 = i2le(buff + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x9a',(ulong)uVar2,"i2le(q + 8)",0x5d,"93",(void *)0x0);
  uVar2 = i2le(buff + 10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x9b',(ulong)uVar2,"i2le(q + 10)",
                      (long)(ptVar8->tm_sec / 2 + ptVar8->tm_min * 0x20 + ptVar8->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar2 = i2le(buff + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x9c',(ulong)uVar2,"i2le(q + 12)",
                      (long)(ptVar8->tm_mon * 0x20 + ptVar8->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar8->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar6 = i4le(buff + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x9d',(ulong)uVar6,"i4le(q + 14)",0,"0",(void *)0x0);
  uVar6 = i4le(buff + 0x12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x9e',(ulong)uVar6,"i4le(q + 18)",0,"0",(void *)0x0);
  uVar6 = i4le(buff + 0x16);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\x9f',(ulong)uVar6,"i4le(q + 22)",0,"0",(void *)0x0);
  uVar2 = i2le(buff + 0x1a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'\xa0',(ulong)uVar2,"i2le(q + 26)",4,"strlen(file_name)",(void *)0x0);
  pcVar10 = buff + 0x1c;
  uVar2 = i2le(pcVar10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¡',(ulong)uVar2,"i2le(q + 28)",0x29,"41",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¢',buff + 0x1e,"q + 30","file","file_name",4,"strlen(file_name)",
                      (void *)0x0);
  uVar2 = i2le(buff + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¥',(ulong)uVar2,"i2le(q)",0x7875,"0x7875",(void *)0x0);
  uVar2 = i2le(buff + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¦',(ulong)uVar2,"i2le(q + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'§',(long)buff[0x26],"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¨',(long)buff[0x27],"q[5]",4,"4",(void *)0x0);
  uVar6 = i4le(buff + 0x28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'©',(ulong)uVar6,"i4le(q + 6)",10,"file_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ª',(long)buff[0x2c],"q[10]",4,"4",(void *)0x0);
  uVar6 = i4le(buff + 0x2d);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'«',(ulong)uVar6,"i4le(q + 11)",0x14,"file_gid",(void *)0x0);
  uVar2 = i2le(buff + 0x24);
  uVar11 = (ulong)uVar2;
  p__00 = buff + uVar11 + 0x26;
  uVar2 = i2le(p__00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'®',(ulong)uVar2,"i2le(q)",0x5455,"0x5455",(void *)0x0);
  uVar2 = i2le(buff + uVar11 + 0x28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¯',(ulong)uVar2,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'°',(long)buff[uVar11 + 0x2a],"q[4]",3,"3",(void *)0x0);
  uVar6 = i4le(buff + uVar11 + 0x2b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'±',(ulong)uVar6,"i4le(q + 5)",now,"now",(void *)0x0);
  uVar6 = i4le(buff + uVar11 + 0x2f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'²',(ulong)uVar6,"i4le(q + 9)",now + 3,"now + 3",(void *)0x0);
  uVar2 = i2le(buff + uVar11 + 0x28);
  uVar11 = (ulong)uVar2;
  uVar2 = i2le(p__00 + uVar11 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'µ',(ulong)uVar2,"i2le(q)",0x6c78,"0x6c78",(void *)0x0);
  uVar2 = i2le(p__00 + uVar11 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¶',(ulong)uVar2,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'·',(long)p__00[uVar11 + 8],"q[4]",7,"7",(void *)0x0);
  uVar2 = i2le(p__00 + uVar11 + 9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¸',(ulong)(uVar2 >> 8),"i2le(q + 5) >> 8",3,"3",(void *)0x0);
  uVar2 = i2le(p__00 + uVar11 + 0xb);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'¹',(ulong)uVar2,"i2le(q + 7)",0,"0",(void *)0x0);
  uVar6 = i4le(p__00 + uVar11 + 0xd);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'º',(ulong)(uVar6 >> 0x10 & 0x3ff),"i4le(q + 9) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar2 = i2le(p__00 + uVar11 + 6);
  uVar3 = i2le(pcVar10);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                   ,L'½',(uint)(p__00 + uVar11 + 4 + (ulong)uVar2 + 4 == buff + (ulong)uVar3 + 0x22
                                ),"q == extra_start + i2le(local_header + 28)",(void *)0x0);
  uVar2 = i2le(pcVar10);
  piVar13 = (int *)(buff + (ulong)uVar2 + 0x22);
  iVar5 = archive_read_next_header(a,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Á',0,"ARCHIVE_OK",(long)iVar5,"archive_read_next_header(zip_archive, &ae)"
                      ,a);
  pcVar10 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
             ,L'Â',"file","\"file\"",pcVar10,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  v2 = archive_read_data(a,local_88,0x17);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ã',0x17,"sizeof(filedata)",v2,
                      "archive_read_data(zip_archive, filedata, sizeof(filedata))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ä',local_88,"filedata","~Z`^YXNWVGHIJ","file_data1",0xd,
                      "sizeof(file_data1)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Æ',local_7b,"filedata + sizeof(file_data1)","UTSMRQPOKL","file_data2",10,
                      "sizeof(file_data2)",(void *)0x0);
  _v1 = piVar13;
  if (piVar13 < buff + (used - 3)) {
    lVar12 = (used - uVar2) + -0x25;
    do {
      _v1 = piVar13;
      if (*piVar13 == 0x8074b50) break;
      piVar13 = (int *)((long)piVar13 + 1);
      lVar12 = lVar12 + -1;
      _v1 = (int *)(buff + (used - 3));
    } while (lVar12 != 0);
  }
  uVar11 = (ulong)uVar1;
  pcVar10 = pcVar15 + uVar11;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ñ',_v1,"q","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  uVar6 = i4le(_v1 + 1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ò',(ulong)uVar6,"i4le(q + 4)",uVar9,"crc",(void *)0x0);
  uVar6 = i4le(_v1 + 3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ó',(ulong)uVar6,"i4le(q + 12)",0x17,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'×',pcVar10,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar1 = i2le(pcVar10 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ø',(ulong)uVar1,"i2le(p + 4)",0x314,"3 * 256 + 20",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ù',(ulong)uVar1,"i2le(p + 6)",0x14,"20",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ú',(ulong)uVar1,"i2le(p + 8)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Û',(ulong)uVar1,"i2le(p + 10)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ü',(ulong)uVar1,"i2le(p + 12)",
                      (long)(ptVar8->tm_sec / 2 + ptVar8->tm_min * 0x20 + ptVar8->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ý',(ulong)uVar1,"i2le(p + 14)",
                      (long)(ptVar8->tm_mon * 0x20 + ptVar8->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar8->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ß',(ulong)uVar6,"i4le(p + 16)",0,"crc",(void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x14);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'à',(ulong)uVar6,"i4le(p + 20)",0,"0",(void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'á',(ulong)uVar6,"i4le(p + 24)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x1c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'â',(ulong)uVar1,"i2le(p + 28)",7,"strlen(folder_name)",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x1e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ã',(ulong)uVar1,"i2le(p + 30)",0x18,"24",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ä',(ulong)uVar1,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'å',(ulong)uVar1,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'æ',(ulong)uVar1,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x26);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ç',(ulong)(uVar6 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1ed,
                      "folder_perm",(void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x2a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'è',(ulong)uVar6,"i4le(p + 42)",(long)(_v1 + 4) - (long)buff,"q - buff",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'é',pcVar15 + uVar11 + 0x2e,"p + 46","folder/","folder_name",7,
                      "strlen(folder_name)",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x35);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ì',(ulong)uVar1,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x37);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'í',(ulong)uVar1,"i2le(p + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'î',(long)pcVar15[uVar11 + 0x39],"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ï',(long)pcVar15[uVar11 + 0x3a],"p[5]",4,"4",(void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x3b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ð',(ulong)uVar6,"i4le(p + 6)",0x1e,"folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ñ',(long)pcVar15[uVar11 + 0x3f],"p[10]",4,"4",(void *)0x0);
  uVar6 = i4le(pcVar15 + uVar11 + 0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ò',(ulong)uVar6,"i4le(p + 11)",0x28,"folder_gid",(void *)0x0);
  uVar1 = i2le(pcVar15 + uVar11 + 0x37);
  uVar11 = (ulong)uVar1;
  uVar1 = i2le(pcVar10 + uVar11 + 0x39);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'õ',(ulong)uVar1,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  uVar1 = i2le(pcVar10 + uVar11 + 0x3b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ö',(ulong)uVar1,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'÷',(long)pcVar10[uVar11 + 0x3d],"p[4]",1,"1",(void *)0x0);
  uVar6 = i4le(pcVar10 + uVar11 + 0x3e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ø',(ulong)uVar6,"i4le(p + 5)",now,"now",(void *)0x0);
  i2le(pcVar10 + uVar11 + 0x3b);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ý',_v1 + 4,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar1 = i2le(_v1 + 5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'þ',(ulong)uVar1,"i2le(q + 4)",0x14,"20",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x16));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ÿ',(ulong)uVar1,"i2le(q + 6)",0,"0",(void *)0x0);
  uVar1 = i2le(_v1 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ā',(ulong)uVar1,"i2le(q + 8)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x1a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ā',(ulong)uVar1,"i2le(q + 10)",
                      (long)(ptVar8->tm_sec / 2 + ptVar8->tm_min * 0x20 + ptVar8->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar1 = i2le(_v1 + 7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ă',(ulong)uVar1,"i2le(q + 12)",
                      (long)(ptVar8->tm_mon * 0x20 + ptVar8->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar8->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar6 = i4le((void *)((long)_v1 + 0x1e));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ă',(ulong)uVar6,"i4le(q + 14)",0,"0",(void *)0x0);
  uVar6 = i4le((void *)((long)_v1 + 0x22));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ą',(ulong)uVar6,"i4le(q + 18)",0,"0",(void *)0x0);
  uVar6 = i4le((void *)((long)_v1 + 0x26));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ą',(ulong)uVar6,"i4le(q + 22)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x2a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ć',(ulong)uVar1,"i2le(q + 26)",7,"strlen(folder_name)",(void *)0x0);
  piVar13 = _v1 + 0xb;
  uVar1 = i2le(piVar13);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ć',(ulong)uVar1,"i2le(q + 28)",0x29,"41",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ĉ',(void *)((long)_v1 + 0x2e),"q + 30","folder/","folder_name",7,
                      "strlen(folder_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x35));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ċ',(ulong)uVar1,"i2le(q)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x37));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Č',(ulong)uVar1,"i2le(q + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'č',(long)*(char *)((long)_v1 + 0x39),"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ď',(long)*(char *)((long)_v1 + 0x3a),"q[5]",4,"4",(void *)0x0);
  uVar6 = i4le((void *)((long)_v1 + 0x3b));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ď',(ulong)uVar6,"i4le(q + 6)",0x1e,"folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Đ',(long)*(char *)((long)_v1 + 0x3f),"q[10]",4,"4",(void *)0x0);
  uVar6 = i4le(_v1 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'đ',(ulong)uVar6,"i4le(q + 11)",0x28,"folder_gid",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x37));
  uVar11 = (ulong)uVar1;
  p_ = (void *)((long)_v1 + uVar11 + 0x39);
  uVar1 = i2le(p_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ĕ',(ulong)uVar1,"i2le(q)",0x5455,"0x5455",(void *)0x0);
  pvVar14 = (void *)((long)_v1 + uVar11 + 0x3b);
  uVar1 = i2le(pvVar14);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ĕ',(ulong)uVar1,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ė',(long)*(char *)((long)_v1 + uVar11 + 0x3d),"q[4]",5,"5",(void *)0x0);
  uVar6 = i4le((void *)((long)_v1 + uVar11 + 0x3e));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ė',(ulong)uVar6,"i4le(q + 5)",now,"now",(void *)0x0);
  uVar6 = i4le((void *)((long)_v1 + uVar11 + 0x42));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ę',(ulong)uVar6,"i4le(q + 9)",now + 5,"now + 5",(void *)0x0);
  uVar1 = i2le(pvVar14);
  uVar11 = (ulong)uVar1;
  pvVar14 = (void *)((long)p_ + uVar11 + 4);
  uVar1 = i2le(pvVar14);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ě',(ulong)uVar1,"i2le(q)",0x6c78,"0x6c78",(void *)0x0);
  p__01 = (void *)((long)p_ + uVar11 + 6);
  uVar1 = i2le(p__01);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ĝ',(ulong)uVar1,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ĝ',(long)*(char *)((long)p_ + uVar11 + 8),"q[4]",7,"7",(void *)0x0);
  uVar1 = i2le((void *)((long)p_ + uVar11 + 9));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ğ',(ulong)(uVar1 >> 8),"i2le(q + 5) >> 8",3,"3",(void *)0x0);
  uVar1 = i2le((void *)((long)p_ + uVar11 + 0xb));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'ğ',(ulong)uVar1,"i2le(q + 7)",0,"0",(void *)0x0);
  uVar6 = i4le((void *)((long)p_ + uVar11 + 0xd));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ġ',(ulong)(uVar6 >> 0x10 & 0x3ff),"i4le(q + 9) >> 16 & 01777",0x1ed,
                      "folder_perm",(void *)0x0);
  uVar1 = i2le(p__01);
  uVar2 = i2le(piVar13);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                   ,L'ģ',(uint)((long)pvVar14 + (ulong)uVar1 + 4 == (long)_v1 + (ulong)uVar2 + 0x35
                                ),"q == extra_start + i2le(local_header + 28)",(void *)0x0);
  uVar1 = i2le(piVar13);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_zstd.c"
                      ,L'Ĩ',(void *)((long)_v1 + (ulong)uVar1 + 0x35),"q","PK\x01\x02",
                      "\"PK\\001\\002\"",4,"4",(void *)0x0);
  archive_read_free(a);
  return;
}

Assistant:

static void verify_zstd_contents(const char *buff, size_t used)
{
	const char *buffend;
	struct archive* zip_archive;
	struct archive_entry *ae;
	char filedata[sizeof(file_data1) + sizeof(file_data2)];
	/* Misc variables */
	unsigned long crc;
	struct tm *tm;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif
	/* p is the pointer to walk over the central directory,
	 * q walks over the local headers, the data and the data descriptors. */
	const char *p, *q, *local_header, *extra_start;

#if defined(HAVE_LOCALTIME_S)
	tm = localtime_s(&tmbuf, &now) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&now, &tmbuf);
#else
	tm = localtime(&now);
#endif

	/* Open archive from memory, we'll need it for checking the file
	 * value */
	assert((zip_archive = archive_read_new()) != NULL);
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_support_format_zip(zip_archive));
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_support_filter_all(zip_archive));
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_open_memory(zip_archive, buff, used));

	/* Remember the end of the archive in memory. */
	buffend = buff + used;

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2le(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2le(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2le(p + 8), i2le(p + 10));
	failure("CD start (%u) + CD length (%u) should == archive size - 22",
	    i4le(p + 12), i4le(p + 16));
	assertEqualInt(i4le(p + 12) + i4le(p + 16), used - 22);
	failure("no zip comment");
	assertEqualInt(i2le(p + 20), 0);

	/* Get address of first entry in central directory. */
	p = buff + i4le(buffend - 6);
	failure("Central file record at offset %u should begin with"
	    " PK\\001\\002 signature",
	    i4le(buffend - 10));

	/* Verify file entry in central directory, except compressed size (offset 20). */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + 63); /* Version made by */
	assertEqualInt(i2le(p + 6), 63); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), 8); /* Flags */
	assertEqualInt(i2le(p + 10), 93); /* Compression method */
	assertEqualInt(i2le(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data1, sizeof(file_data1));
	crc = bitcrc32(crc, file_data2, sizeof(file_data2));
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4le(p + 24), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(p + 30), 24); /* Extra field length */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = p + 46 + strlen(file_name);

	assertEqualInt(i2le(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
/* TODO */
	p = p + 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), now); /* 'UT' mtime */
	p = p + 4 + i2le(p + 2);

	/* Verify local header of file entry. */
	local_header = q = buff;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(q + 4), 63); /* Version needed to extract */
	assertEqualInt(i2le(q + 6), 8); /* Flags: bit 3 = length-at-end (required because CRC32 is unknown) */
	assertEqualInt(i2le(q + 8), 93); /* Compression method */
	assertEqualInt(i2le(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4le(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4le(q + 18), 0); /* Compressed size, must be zero because of length-at-end */
	assertEqualInt(i4le(q + 22), 0); /* Uncompressed size, must be zero because of length-at-end */
	assertEqualInt(i2le(q + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, file_name, strlen(file_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(file_name);

	assertEqualInt(i2le(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(q + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(q + 11), file_gid); /* 'Ux' GID */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 3); /* 'UT' flags */
	assertEqualInt(i4le(q + 5), now); /* 'UT' mtime */
	assertEqualInt(i4le(q + 9), now + 3); /* 'UT' atime */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x6c78); /* 'xl' experimental extension header */
	assertEqualInt(i2le(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* Bitmap of fields included. */
	assertEqualInt(i2le(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2le(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4le(q + 9) >> 16 & 01777, file_perm); /* external file attributes */
	q = q + 4 + i2le(q + 2);

	assert(q == extra_start + i2le(local_header + 28));
	q = extra_start + i2le(local_header + 28);

	/* Verify data of file entry, using our own zip reader to test. */
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_next_header(zip_archive, &ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualIntA(zip_archive, sizeof(filedata), archive_read_data(zip_archive, filedata, sizeof(filedata)));
	assertEqualMem(filedata, file_data1, sizeof(file_data1));
	assertEqualMem(filedata + sizeof(file_data1), file_data2,
		sizeof(file_data2));

	/* Skip data of file entry in q */
	while (q < buffend - 3) {
		if (memcmp(q, "PK\007\010", 4) == 0) {
			break;
		}
		q++;
	}

	/* Verify data descriptor of file entry, except compressed size (offset 8). */
	assertEqualMem(q, "PK\007\010", 4); /* Signature */
	assertEqualInt(i4le(q + 4), crc); /* CRC-32 */
	assertEqualInt(i4le(q + 12), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	q = q + 16;

	/* Verify folder entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + 20); /* Version made by */
	assertEqualInt(i2le(p + 6), 20); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), 0); /* Flags */
	assertEqualInt(i2le(p + 10), 0); /* Compression method */
	assertEqualInt(i2le(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = 0;
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4le(p + 20), 0); /* Compressed size */
	assertEqualInt(i4le(p + 24), 0); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2le(p + 30), 24); /* Extra field length */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, folder_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), q - buff); /* Offset of local header */
	assertEqualMem(p + 46, folder_name, strlen(folder_name)); /* Pathname */
	p = p + 46 + strlen(folder_name);

	assertEqualInt(i2le(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(p + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(p + 11), folder_gid); /* 'ux' GID */
	p = p + 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), now); /* 'UT' mtime */
	p = p + 4 + i2le(p + 2);

	/* Verify local header of folder entry. */
	local_header = q;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(q + 4), 20); /* Version needed to extract */
	assertEqualInt(i2le(q + 6), 0); /* Flags */
	assertEqualInt(i2le(q + 8), 0); /* Compression method */
	assertEqualInt(i2le(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4le(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4le(q + 18), 0); /* Compressed size */
	assertEqualInt(i4le(q + 22), 0); /* Uncompressed size */
	assertEqualInt(i2le(q + 26), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2le(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, folder_name, strlen(folder_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(folder_name);

	assertEqualInt(i2le(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(q + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(q + 11), folder_gid); /* 'ux' GID */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 5); /* 'UT' flags */
	assertEqualInt(i4le(q + 5), now); /* 'UT' mtime */
	assertEqualInt(i4le(q + 9), now + 5); /* 'UT' atime */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x6c78); /* 'xl' experimental extension header */
	assertEqualInt(i2le(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* bitmap of fields */
	assertEqualInt(i2le(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2le(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4le(q + 9) >> 16 & 01777, folder_perm); /* external file attributes */
	q = q + 4 + i2le(q + 2);

	assert(q == extra_start + i2le(local_header + 28));
	q = extra_start + i2le(local_header + 28);

	/* There should not be any data in the folder entry,
	 * so the first central directory entry should be next: */
	assertEqualMem(q, "PK\001\002", 4); /* Signature */

	/* Close archive, in case. */
	archive_read_free(zip_archive);
}